

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

optional<Vault::HttpResponse> * __thiscall
Vault::HttpClient::executeRequest
          (optional<Vault::HttpResponse> *__return_storage_ptr__,HttpClient *this,Url *url,
          Token *token,Namespace *ns,CurlSetupCallback *setupCallback,
          CurlHeaderCallback *curlHeaderCallback,HttpErrorCallback *errorCallback)

{
  path *__p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 uVar3;
  CurlWrapper curlWrapper;
  path local_a8;
  CurlWrapper local_80;
  long *local_50 [2];
  long local_40 [2];
  
  CurlWrapper::CurlWrapper(&local_80,errorCallback);
  if ((token->value_)._M_string_length != 0) {
    Vault::operator+(&local_a8._M_pathname,"X-Vault-Token: ",token);
    local_80.slist_ =
         (curl_slist *)curl_slist_append(local_80.slist_,local_a8._M_pathname._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_pathname._M_dataplus._M_p != &local_a8._M_pathname.field_2) {
      operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                      local_a8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  if ((ns->value_)._M_string_length != 0) {
    Vault::operator+(&local_a8._M_pathname,"X-Vault-Namespace: ",ns);
    local_80.slist_ =
         (curl_slist *)curl_slist_append(local_80.slist_,local_a8._M_pathname._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_pathname._M_dataplus._M_p != &local_a8._M_pathname.field_2) {
      operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                      local_a8._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_a8._M_pathname.field_2;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Content-Type: application/json","");
  local_80.slist_ =
       (curl_slist *)curl_slist_append(local_80.slist_,local_a8._M_pathname._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_pathname._M_dataplus._M_p = (pointer)local_80.slist_;
  if ((curlHeaderCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_80.slist_ =
         (*curlHeaderCallback->_M_invoker)((_Any_data *)curlHeaderCallback,(curl_slist **)&local_a8)
    ;
    if ((this->config_).verify_ == true) {
      __p = &(this->config_).caBundle_;
      std::filesystem::__cxx11::path::path(&local_a8,__p);
      sVar2 = local_a8._M_pathname._M_string_length;
      std::filesystem::__cxx11::path::~path(&local_a8);
      if (sVar2 != 0) {
        std::filesystem::__cxx11::path::path(&local_a8,__p);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_a8._M_pathname._M_dataplus._M_p,
                   (curl_slist *)
                   (local_a8._M_pathname._M_dataplus._M_p + local_a8._M_pathname._M_string_length));
        curl_easy_setopt(local_80.curl_,0x2751,local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        std::filesystem::__cxx11::path::~path(&local_a8);
      }
      uVar3 = 1;
      curl_easy_setopt(local_80.curl_,0x40,1);
    }
    else {
      uVar3 = 0;
      curl_easy_setopt(local_80.curl_,0x40,0);
    }
    curl_easy_setopt(local_80.curl_,0x51,uVar3);
    curl_easy_setopt(local_80.curl_,0x4e,(this->config_).connectTimeout_.value_);
    curl_easy_setopt(local_80.curl_,0xd,(this->config_).requestTimeout_.value_);
    curl_easy_setopt(local_80.curl_,0x14,(this->config_).lowSpeedTimeout_.value_);
    curl_easy_setopt(local_80.curl_,0x13,(this->config_).lowSpeedLimit_.value_);
    curl_easy_setopt(local_80.curl_,0x2712,(url->value_)._M_dataplus._M_p);
    if ((this->config_).debug_ == true) {
      curl_easy_setopt(local_80.curl_,0x29,1);
    }
    local_a8._M_pathname._M_dataplus._M_p = (pointer)local_80.curl_;
    if ((setupCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*setupCallback->_M_invoker)((_Any_data *)setupCallback,(void **)&local_a8);
      CurlWrapper::execute(__return_storage_ptr__,&local_80);
      CurlWrapper::~CurlWrapper(&local_80);
      return __return_storage_ptr__;
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

std::optional<Vault::HttpResponse> Vault::HttpClient::executeRequest(
    const Vault::Url &url, const Vault::Token &token,
    const Vault::Namespace &ns, const Vault::CurlSetupCallback &setupCallback,
    const Vault::CurlHeaderCallback &curlHeaderCallback,
    const Vault::HttpErrorCallback &errorCallback) const {
  CurlWrapper curlWrapper{errorCallback};

  if (!token.empty()) {
    curlWrapper.appendHeader("X-Vault-Token: " + token);
  }

  if (!ns.empty()) {
    curlWrapper.appendHeader("X-Vault-Namespace: " + ns);
  }

  curlWrapper.appendHeader("Content-Type: application/json");
  curlWrapper.setupHeaders(curlHeaderCallback);

  if (config_.getVerify()) {
    if (!config_.getCaBundle().empty()) {
      curlWrapper.setOption(CURLOPT_CAINFO,
                            config_.getCaBundle().u8string().c_str());
    }

    curlWrapper.setOption(CURLOPT_SSL_VERIFYPEER, 1L);
    curlWrapper.setOption(CURLOPT_SSL_VERIFYHOST, 1L);
  } else {
    curlWrapper.setOption(CURLOPT_SSL_VERIFYPEER, 0L);
    curlWrapper.setOption(CURLOPT_SSL_VERIFYHOST, 0L);
  }

  curlWrapper.setOption(CURLOPT_CONNECTTIMEOUT,
                        config_.getConnectTimeout().value());
  curlWrapper.setOption(CURLOPT_TIMEOUT, config_.getRequestTimeout().value());
  curlWrapper.setOption(CURLOPT_LOW_SPEED_TIME,
                        config_.getLowSpeedTimeout().value());
  curlWrapper.setOption(CURLOPT_LOW_SPEED_LIMIT,
                        config_.getLowSpeedLimit().value());
  curlWrapper.setOption(CURLOPT_URL, url.value().c_str());

  if (config_.getDebug()) {
    curlWrapper.setOption(CURLOPT_VERBOSE, 1L);
  }

  curlWrapper.setupOptions(setupCallback);

  return curlWrapper.execute();
}